

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_compress_fast_extState
              (void *state,char *source,char *dest,int inputSize,int maxOutputSize,int acceleration)

{
  short sVar1;
  char cVar2;
  int iVar3;
  BYTE *s;
  long *plVar4;
  ulong uVar5;
  short *psVar6;
  char *pcVar7;
  ulong uVar8;
  long *plVar9;
  ulong *puVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  ulong *puVar15;
  ulong *puVar16;
  BYTE *s_2;
  ulong uVar17;
  ulong uVar18;
  char *pcVar19;
  int iVar20;
  long *plVar21;
  long *plVar22;
  short *psVar23;
  undefined4 in_register_00000084;
  ulong *puVar24;
  ulong uVar25;
  ulong uVar26;
  char cVar27;
  long lVar28;
  void *pvVar29;
  BYTE *e;
  long *plVar30;
  uint uVar31;
  char *pcVar32;
  int *piVar33;
  long lVar34;
  int *piVar35;
  BYTE *d;
  int *piVar36;
  int iVar37;
  BYTE *e_1;
  char *pcVar38;
  bool bVar39;
  U16 *hashTable;
  long *local_b8;
  long *local_b0;
  int local_68;
  
  piVar33 = (int *)CONCAT44(in_register_00000084,maxOutputSize);
  pcVar19 = (char *)(ulong)(uint)maxOutputSize;
  iVar37 = 0;
  piVar35 = (int *)state;
  if (((ulong)state & 7) == 0 && state != (void *)0x0) {
    memset(state,0,0x4020);
    pvVar29 = state;
  }
  else {
    pvVar29 = (void *)0x0;
  }
  iVar3 = 1;
  if (1 < acceleration) {
    iVar3 = acceleration;
  }
  if ((uint)inputSize < 0x7e000001) {
    iVar37 = (uint)((ulong)(uint)inputSize * 0x8080808081 >> 0x27) + 0x10;
  }
  uVar14 = *(uint *)((long)pvVar29 + 0x4000);
  uVar8 = (long)source - (ulong)uVar14;
  iVar20 = (int)uVar8;
  sVar1 = (short)uVar8;
  local_68 = (int)dest;
  if (maxOutputSize < iVar37) {
    pcVar32 = dest + maxOutputSize;
    if (inputSize < 0x1000b) {
      if (0x7e000000 < (uint)inputSize) {
        return 0;
      }
      *(int *)((long)pvVar29 + 0x4018) = *(int *)((long)pvVar29 + 0x4018) + inputSize;
      *(uint *)((long)pvVar29 + 0x4000) = uVar14 + inputSize;
      *(undefined2 *)((long)pvVar29 + 0x4006) = 3;
      local_b8 = (long *)source;
      if (0xc < inputSize) {
        *(short *)((long)pvVar29 + (ulong)((uint)(*(int *)source * -0x61c8864f) >> 0x13) * 2) =
             (short)uVar14;
        piVar35 = (int *)(source + 1);
        uVar17 = (ulong)((uint)(*(int *)(source + 1) * -0x61c8864f) >> 0x13);
        psVar23 = (short *)dest;
        do {
          iVar20 = 1;
          piVar33 = piVar35;
          iVar37 = iVar3 << 6;
          do {
            piVar35 = piVar33;
            piVar33 = (int *)((long)iVar20 + (long)piVar35);
            if (source + (long)inputSize + -0xb < piVar33) {
              iVar12 = 2;
            }
            else {
              uVar18 = (ulong)*(ushort *)((long)pvVar29 + uVar17 * 2);
              iVar20 = *piVar33;
              *(short *)((long)pvVar29 + uVar17 * 2) = (short)piVar35 - sVar1;
              iVar12 = 7;
              if (*(int *)(uVar8 + uVar18) != *piVar35) {
                iVar12 = 0;
              }
              pcVar19 = (char *)(uVar18 + uVar8);
              uVar17 = (ulong)((uint)(iVar20 * -0x61c8864f) >> 0x13);
            }
            iVar20 = iVar37 >> 6;
            iVar37 = iVar37 + 1;
          } while (iVar12 == 0);
          if (iVar12 == 7) {
            iVar12 = 0;
          }
          dest = (char *)psVar23;
          if (iVar12 == 0) {
            uVar13 = (int)piVar35 - (int)local_b8;
            lVar34 = 0;
            cVar2 = (char)piVar35 * '\x10' + (char)local_b8 * -0x10;
            uVar14 = uVar13 - 0xf;
            do {
              uVar31 = uVar14;
              cVar27 = cVar2;
              lVar28 = lVar34;
              pcVar38 = pcVar19 + lVar28;
              piVar33 = (int *)((long)piVar35 + lVar28);
              if ((pcVar38 <= source) || (piVar33 <= local_b8)) break;
              lVar34 = lVar28 + -1;
              cVar2 = cVar27 + -0x10;
              uVar14 = uVar31 - 1;
            } while (*(char *)((long)piVar35 + lVar28 + -1) == pcVar19[lVar28 + -1]);
            iVar37 = (int)lVar28;
            uVar18 = (ulong)(uint)(iVar37 + ((int)piVar35 - (int)local_b8));
            dest = (char *)((long)psVar23 + 1);
            pcVar7 = (char *)((long)psVar23 +
                             ((ulong)uVar13 + lVar28 & 0xffffffff) / 0xff + uVar18 + 9);
            if (pcVar32 < pcVar7) {
              iVar12 = 1;
            }
            else {
              if ((uint)((ulong)uVar13 + lVar28) < 0xf) {
                *(char *)psVar23 = cVar27;
                psVar6 = (short *)dest;
              }
              else {
                uVar5 = (ulong)(uVar13 - 0xf) + lVar28;
                *(char *)psVar23 = -0x10;
                if (0xfe < (int)uVar5) {
                  if (0x1fc < (int)uVar31) {
                    uVar31 = 0x1fd;
                  }
                  uVar14 = (uVar13 - uVar31) + iVar37 + 0xef;
                  uVar5 = (ulong)uVar14 / 0xff;
                  memset(dest,0xff,(ulong)(uVar14 / 0xff + 1));
                  dest = (char *)((long)psVar23 + uVar5 + 2);
                  uVar5 = (ulong)((uVar13 - 0x10e) + iVar37 + (int)uVar5 * -0xff);
                }
                *dest = (char)uVar5;
                psVar6 = (short *)((long)dest + 1);
              }
              dest = (char *)(uVar18 + (long)psVar6);
              plVar22 = local_b8;
              do {
                *(long *)psVar6 = *plVar22;
                psVar6 = psVar6 + 4;
                plVar22 = (long *)((long)plVar22 + 8);
              } while (psVar6 < dest);
              iVar12 = 0;
            }
            pcVar19 = pcVar38;
            piVar35 = piVar33;
            if (pcVar7 <= pcVar32) {
              do {
                *(short *)dest = (short)piVar33 - (short)pcVar38;
                puVar15 = (ulong *)(piVar33 + 1);
                puVar16 = (ulong *)(pcVar38 + 4);
                puVar10 = puVar15;
                if (puVar15 < source + (long)inputSize + -0xc) {
                  uVar5 = *(ulong *)(piVar33 + 1) ^ *(ulong *)(pcVar38 + 4);
                  uVar18 = 0;
                  if (uVar5 != 0) {
                    for (; (uVar5 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                    }
                  }
                  uVar18 = uVar18 >> 3 & 0x1fffffff;
                  puVar10 = (ulong *)(piVar33 + 3);
                  puVar16 = (ulong *)(pcVar38 + 0xc);
                  if (*(ulong *)(pcVar38 + 4) == *(ulong *)(piVar33 + 1)) goto LAB_0010dd91;
                }
                else {
LAB_0010dd91:
                  do {
                    if (source + (long)inputSize + -0xc <= puVar10) {
                      if ((puVar10 < source + (long)inputSize + -8) &&
                         ((int)*puVar16 == (int)*puVar10)) {
                        puVar10 = (ulong *)((long)puVar10 + 4);
                        puVar16 = (ulong *)((long)puVar16 + 4);
                      }
                      if ((puVar10 < source + (long)inputSize + -6) &&
                         ((short)*puVar16 == (short)*puVar10)) {
                        puVar10 = (ulong *)((long)puVar10 + 2);
                        puVar16 = (ulong *)((long)puVar16 + 2);
                      }
                      if (puVar10 < source + (long)inputSize + -5) {
                        puVar10 = (ulong *)((long)puVar10 +
                                           (ulong)((char)*puVar16 == (char)*puVar10));
                      }
                      uVar18 = (ulong)(uint)((int)puVar10 - (int)puVar15);
                      goto LAB_0010ddce;
                    }
                    uVar18 = *puVar16;
                    uVar5 = *puVar10;
                    uVar25 = uVar5 ^ uVar18;
                    uVar26 = 0;
                    if (uVar25 != 0) {
                      for (; (uVar25 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                      }
                    }
                    iVar37 = (int)puVar10;
                    puVar16 = puVar16 + 1;
                    puVar10 = puVar10 + 1;
                  } while (uVar18 == uVar5);
                  uVar18 = (ulong)((((uint)(uVar26 >> 3) & 0x1fffffff) + iVar37) - (int)puVar15);
                }
LAB_0010ddce:
                psVar6 = (short *)((long)dest + 2);
                uVar14 = (uint)uVar18;
                pcVar7 = (char *)((long)dest + (ulong)(uVar14 + 0xf0) / 0xff + 8);
                if (pcVar7 <= pcVar32) {
                  if (uVar14 < 0xf) {
                    *(char *)psVar23 = (char)*psVar23 + (char)uVar18;
                  }
                  else {
                    *(char *)psVar23 = (char)*psVar23 + '\x0f';
                    uVar13 = uVar14 - 0xf;
                    psVar6[0] = -1;
                    psVar6[1] = -1;
                    if (0x3fb < uVar13) {
                      uVar14 = uVar14 - 0x40b;
                      memset((short *)((long)dest + 6),0xff,(ulong)((uVar14 / 0x3fc) * 4 + 4));
                      uVar13 = uVar14 % 0x3fc;
                      psVar6 = (short *)((long)dest + (ulong)((uVar14 / 0x3fc) * 4) + 6);
                    }
                    pcVar19 = (char *)((long)psVar6 + (ulong)uVar13 / 0xff);
                    psVar6 = (short *)(pcVar19 + 1);
                    *pcVar19 = (char)(uVar13 / 0xff) + (char)uVar13;
                  }
                }
                lVar34 = (long)piVar33 + uVar18;
                piVar33 = (int *)(lVar34 + 4);
                pcVar19 = pcVar38;
                dest = (char *)psVar6;
                piVar35 = piVar33;
                if (pcVar32 < pcVar7) {
                  iVar12 = 1;
                  goto LAB_0010dfca;
                }
                local_b8 = (long *)piVar33;
                if (source + (long)inputSize + -0xb <= piVar33) {
                  iVar12 = 3;
                  goto LAB_0010dfca;
                }
                *(short *)((long)pvVar29 +
                          (ulong)((uint)(*(int *)(lVar34 + 2) * -0x61c8864f) >> 0x13) * 2) =
                     ((short)lVar34 + 2) - sVar1;
                uVar18 = (ulong)((uint)(*piVar33 * -0x61c8864f) >> 0x13);
                uVar5 = (ulong)*(ushort *)((long)pvVar29 + uVar18 * 2);
                *(short *)((long)pvVar29 + uVar18 * 2) = (short)piVar33 - sVar1;
                iVar37 = *(int *)(uVar8 + uVar5);
                iVar20 = *piVar33;
                if (iVar37 == iVar20) {
                  *(char *)psVar6 = '\0';
                  psVar23 = psVar6;
                  psVar6 = (short *)((long)psVar6 + 1);
                }
                pcVar38 = (char *)(uVar5 + uVar8);
                dest = (char *)psVar6;
              } while (iVar37 == iVar20);
              piVar35 = (int *)(lVar34 + 5);
              uVar17 = (ulong)((uint)(*(int *)(lVar34 + 5) * -0x61c8864f) >> 0x13);
              iVar12 = 0;
              pcVar19 = pcVar38;
            }
          }
LAB_0010dfca:
          psVar23 = (short *)dest;
        } while (iVar12 == 0);
        if (1 < iVar12 - 2U) {
          return 0;
        }
      }
      pcVar38 = source + ((long)inputSize - (long)local_b8);
      pcVar19 = (char *)((long)dest + (long)(pcVar38 + (ulong)(pcVar38 + 0xf0) / 0xff + 1));
      if (pcVar19 <= pcVar32) {
        if (pcVar38 < (char *)0xf) {
          *dest = (char)pcVar38 << 4;
        }
        else {
          pcVar7 = pcVar38 + -0xf;
          *dest = -0x10;
          psVar23 = (short *)((long)dest + 1);
          if ((char *)0xfe < pcVar7) {
            uVar8 = (ulong)(pcVar38 + -0x10e) / 0xff;
            memset(psVar23,0xff,uVar8 + 1);
            psVar23 = (short *)((long)dest + uVar8 + 2);
            pcVar7 = pcVar38 + uVar8 * -0xff + -0x10e;
          }
          *(char *)psVar23 = (char)pcVar7;
          dest = (char *)psVar23;
        }
        memcpy((char *)((long)dest + 1),local_b8,(size_t)pcVar38);
        dest = (char *)((long)dest + (long)(pcVar38 + 1));
      }
      if (pcVar19 <= pcVar32) {
        return (int)dest - local_68;
      }
      return 0;
    }
    if ((uint)inputSize < 0x7e000001) {
      *(int *)((long)pvVar29 + 0x4018) = *(int *)((long)pvVar29 + 0x4018) + inputSize;
      *(uint *)((long)pvVar29 + 0x4000) = inputSize + uVar14;
      *(undefined2 *)((long)pvVar29 + 0x4006) = 2;
      *(uint *)((long)pvVar29 + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) =
           uVar14;
      plVar22 = (long *)(source + 1);
      uVar17 = (ulong)(*(long *)(source + 1) * -0x30e4432345000000) >> 0x34;
      local_b8 = (long *)dest;
      local_b0 = (long *)source;
      do {
        iVar12 = 1;
        iVar37 = iVar3 << 6;
        while( true ) {
          plVar21 = (long *)((long)iVar12 + (long)plVar22);
          iVar12 = (int)plVar22;
          if (source + ((ulong)(uint)inputSize - 0xb) < plVar21) {
            iVar11 = 2;
          }
          else {
            uVar14 = *(uint *)((long)pvVar29 + uVar17 * 4);
            piVar35 = (int *)(uVar14 + uVar8);
            uVar18 = (ulong)(*plVar21 * -0x30e4432345000000) >> 0x34;
            *(int *)((long)pvVar29 + uVar17 * 4) = iVar12 - iVar20;
            iVar11 = 8;
            uVar17 = uVar18;
            if (((uint)(iVar12 - iVar20) <= uVar14 + 0xffff) &&
               (iVar11 = 7, *piVar35 != (int)*plVar22)) {
              iVar11 = 0;
            }
          }
          if ((iVar11 != 0) && (iVar11 != 8)) break;
          iVar12 = iVar37 >> 6;
          iVar37 = iVar37 + 1;
          plVar22 = plVar21;
        }
        if (iVar11 == 7) {
          iVar11 = 0;
        }
        plVar21 = local_b8;
        if (iVar11 == 0) {
          uVar13 = iVar12 - (int)local_b0;
          lVar34 = 0;
          cVar2 = (char)plVar22 * '\x10' + (char)local_b0 * -0x10;
          uVar14 = uVar13 - 0xf;
          do {
            uVar31 = uVar14;
            cVar27 = cVar2;
            lVar28 = lVar34;
            piVar33 = (int *)((long)piVar35 + lVar28);
            plVar4 = (long *)((long)plVar22 + lVar28);
            if ((piVar33 <= source) || (plVar4 <= local_b0)) break;
            lVar34 = lVar28 + -1;
            cVar2 = cVar27 + -0x10;
            uVar14 = uVar31 - 1;
          } while (*(char *)((long)plVar22 + lVar28 + -1) == *(char *)((long)piVar35 + lVar28 + -1))
          ;
          iVar37 = (int)lVar28;
          uVar18 = (ulong)(uint)((iVar12 - (int)local_b0) + iVar37);
          plVar21 = (long *)((long)local_b8 + 1);
          pcVar19 = (char *)((long)local_b8 +
                            ((ulong)uVar13 + lVar28 & 0xffffffff) / 0xff + uVar18 + 9);
          if (pcVar32 < pcVar19) {
            iVar11 = 1;
          }
          else {
            if ((uint)((ulong)uVar13 + lVar28) < 0xf) {
              *(char *)local_b8 = cVar27;
              plVar22 = plVar21;
            }
            else {
              uVar5 = (ulong)(uVar13 - 0xf) + lVar28;
              *(char *)local_b8 = -0x10;
              if (0xfe < (int)uVar5) {
                if (0x1fc < (int)uVar31) {
                  uVar31 = 0x1fd;
                }
                uVar14 = (uVar13 - uVar31) + iVar37 + 0xef;
                uVar5 = (ulong)uVar14 / 0xff;
                memset(plVar21,0xff,(ulong)(uVar14 / 0xff + 1));
                plVar21 = (long *)((long)local_b8 + uVar5 + 2);
                uVar5 = (ulong)((uVar13 - 0x10e) + iVar37 + (int)uVar5 * -0xff);
              }
              *(char *)plVar21 = (char)uVar5;
              plVar22 = (long *)((long)plVar21 + 1);
            }
            plVar21 = (long *)(uVar18 + (long)plVar22);
            plVar9 = local_b0;
            do {
              *plVar22 = *plVar9;
              plVar22 = plVar22 + 1;
              plVar9 = plVar9 + 1;
            } while (plVar22 < plVar21);
            iVar11 = 0;
          }
          plVar22 = plVar4;
          piVar35 = piVar33;
          if (pcVar19 <= pcVar32) {
            do {
              *(short *)plVar21 = (short)plVar4 - (short)piVar33;
              puVar16 = (ulong *)((long)plVar4 + 4);
              puVar15 = (ulong *)(piVar33 + 1);
              puVar10 = puVar16;
              uVar18 = uVar8;
              if (puVar16 < source + ((ulong)(uint)inputSize - 0xc)) {
                uVar5 = *(ulong *)((long)plVar4 + 4) ^ *(ulong *)(piVar33 + 1);
                uVar18 = 0;
                if (uVar5 != 0) {
                  for (; (uVar5 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                  }
                }
                uVar18 = uVar18 >> 3 & 0x1fffffff;
                uVar14 = (uint)uVar18;
                puVar10 = (ulong *)((long)plVar4 + 0xc);
                puVar15 = (ulong *)(piVar33 + 3);
                if (*(ulong *)(piVar33 + 1) == *(ulong *)((long)plVar4 + 4)) goto LAB_0010d25d;
              }
              else {
LAB_0010d25d:
                do {
                  if (source + ((ulong)(uint)inputSize - 0xc) <= puVar10) {
                    if ((puVar10 < source + ((ulong)(uint)inputSize - 8)) &&
                       ((int)*puVar15 == (int)*puVar10)) {
                      puVar10 = (ulong *)((long)puVar10 + 4);
                      puVar15 = (ulong *)((long)puVar15 + 4);
                    }
                    if ((puVar10 < source + ((ulong)(uint)inputSize - 6)) &&
                       ((short)*puVar15 == (short)*puVar10)) {
                      puVar10 = (ulong *)((long)puVar10 + 2);
                      puVar15 = (ulong *)((long)puVar15 + 2);
                    }
                    if (puVar10 < source + ((ulong)(uint)inputSize - 5)) {
                      puVar10 = (ulong *)((long)puVar10 + (ulong)((char)*puVar15 == (char)*puVar10))
                      ;
                    }
                    uVar14 = (int)puVar10 - (int)puVar16;
                    break;
                  }
                  uVar5 = *puVar15;
                  uVar25 = *puVar10 ^ uVar5;
                  uVar26 = 0;
                  if (uVar25 != 0) {
                    for (; (uVar25 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                    }
                  }
                  puVar24 = (ulong *)((uVar26 >> 3 & 0x1fffffff) + (long)puVar10);
                  puVar15 = puVar15 + 1;
                  bVar39 = uVar5 == *puVar10;
                  puVar10 = puVar10 + 1;
                  if (!bVar39) {
                    puVar10 = puVar24;
                  }
                  uVar18 = uVar18 & 0xffffffff;
                  if (!bVar39) {
                    uVar18 = (ulong)(uint)((int)puVar24 - (int)puVar16);
                  }
                  uVar14 = (uint)uVar18;
                } while (bVar39);
              }
              plVar9 = (long *)((long)plVar21 + 2);
              pcVar19 = (char *)((long)plVar21 + (ulong)(uVar14 + 0xf0) / 0xff + 8);
              if (pcVar19 <= pcVar32) {
                if (uVar14 < 0xf) {
                  *(char *)local_b8 = (char)*local_b8 + (char)uVar14;
                }
                else {
                  *(char *)local_b8 = (char)*local_b8 + '\x0f';
                  uVar13 = uVar14 - 0xf;
                  *(undefined4 *)plVar9 = 0xffffffff;
                  if (0x3fb < uVar13) {
                    uVar31 = uVar14 - 0x40b;
                    memset((char *)((long)plVar21 + 6),0xff,(ulong)((uVar31 / 0x3fc) * 4 + 4));
                    uVar13 = uVar31 % 0x3fc;
                    plVar9 = (long *)((long)plVar21 + (ulong)((uVar31 / 0x3fc) * 4) + 6);
                  }
                  pcVar38 = (char *)((long)plVar9 + (ulong)uVar13 / 0xff);
                  plVar9 = (long *)(pcVar38 + 1);
                  *pcVar38 = (char)(uVar13 / 0xff) + (char)uVar13;
                }
              }
              lVar34 = (ulong)uVar14 + (long)plVar4;
              plVar4 = (long *)(lVar34 + 4);
              plVar22 = plVar4;
              plVar21 = plVar9;
              piVar35 = piVar33;
              if (pcVar32 < pcVar19) {
                iVar11 = 1;
                goto LAB_0010d49a;
              }
              local_b0 = plVar4;
              if (source + ((ulong)(uint)inputSize - 0xb) <= plVar4) {
                iVar11 = 3;
                goto LAB_0010d49a;
              }
              *(int *)((long)pvVar29 +
                      ((ulong)(*(long *)(lVar34 + 2) * -0x30e4432345000000) >> 0x34) * 4) =
                   ((int)lVar34 + 2) - iVar20;
              uVar18 = (ulong)(*plVar4 * -0x30e4432345000000) >> 0x34;
              uVar13 = (int)plVar4 - iVar20;
              uVar14 = *(uint *)((long)pvVar29 + uVar18 * 4);
              piVar33 = (int *)(uVar14 + uVar8);
              *(uint *)((long)pvVar29 + uVar18 * 4) = uVar13;
              bVar39 = true;
              if ((uVar13 <= uVar14 + 0xffff) && (*piVar33 == *(int *)plVar4)) {
                *(char *)plVar9 = '\0';
                bVar39 = false;
                plVar21 = (long *)((long)plVar9 + 1);
                local_b8 = plVar9;
              }
            } while (!bVar39);
            uVar17 = (ulong)(*(long *)(lVar34 + 5) * -0x30e4432345000000) >> 0x34;
            iVar11 = 0;
            plVar22 = (long *)(lVar34 + 5);
            piVar35 = piVar33;
          }
        }
LAB_0010d49a:
        local_b8 = plVar21;
      } while (iVar11 == 0);
      if (iVar11 - 2U < 2) {
        pcVar38 = source + ((ulong)(uint)inputSize - (long)local_b0);
        pcVar19 = (char *)((long)plVar21 + (long)(pcVar38 + (ulong)(pcVar38 + 0xf0) / 0xff + 1));
        if (pcVar19 <= pcVar32) {
          if (pcVar38 < (char *)0xf) {
            *(char *)plVar21 = (char)pcVar38 << 4;
          }
          else {
            pcVar7 = pcVar38 + -0xf;
            *(char *)plVar21 = -0x10;
            plVar22 = (long *)((long)plVar21 + 1);
            if ((char *)0xfe < pcVar7) {
              uVar8 = (ulong)(pcVar38 + -0x10e) / 0xff;
              memset((long *)((long)plVar21 + 1),0xff,uVar8 + 1);
              pcVar7 = pcVar38 + uVar8 * -0xff + -0x10e;
              plVar22 = (long *)((long)plVar21 + uVar8 + 2);
            }
            plVar21 = plVar22;
            *(char *)plVar21 = (char)pcVar7;
          }
          memcpy((char *)((long)plVar21 + 1),local_b0,(size_t)pcVar38);
          plVar21 = (long *)((long)plVar21 + (long)(pcVar38 + 1));
        }
        iVar37 = (int)plVar21;
        if (pcVar19 <= pcVar32) goto LAB_0010e5d0;
      }
    }
  }
  else if (inputSize < 0x1000b) {
    if ((uint)inputSize < 0x7e000001) {
      pcVar19 = source + inputSize;
      *(int *)((long)pvVar29 + 0x4018) = *(int *)((long)pvVar29 + 0x4018) + inputSize;
      *(uint *)((long)pvVar29 + 0x4000) = uVar14 + inputSize;
      *(undefined2 *)((long)pvVar29 + 0x4006) = 3;
      if (0xc < inputSize) {
        *(short *)((long)pvVar29 + (ulong)((uint)(*(int *)source * -0x61c8864f) >> 0x13) * 2) =
             (short)uVar14;
        piVar35 = (int *)(source + 1);
        uVar14 = (uint)(*(int *)(source + 1) * -0x61c8864f) >> 0x13;
        piVar33 = (int *)source;
        pcVar32 = pcVar19;
        do {
          iVar20 = 1;
          piVar36 = piVar35;
          iVar37 = iVar3 << 6;
          do {
            piVar35 = piVar36;
            piVar36 = (int *)((long)iVar20 + (long)piVar35);
            if (source + (long)inputSize + -0xb < piVar36) {
              iVar12 = 2;
            }
            else {
              uVar17 = (ulong)*(ushort *)((long)pvVar29 + (ulong)uVar14 * 2);
              iVar20 = *piVar36;
              *(short *)((long)pvVar29 + (ulong)uVar14 * 2) = (short)piVar35 - sVar1;
              iVar12 = 7;
              if (*(int *)(uVar8 + uVar17) != *piVar35) {
                iVar12 = 0;
              }
              pcVar32 = (char *)(uVar17 + uVar8);
              uVar14 = (uint)(iVar20 * -0x61c8864f) >> 0x13;
            }
            iVar20 = iVar37 >> 6;
            iVar37 = iVar37 + 1;
          } while (iVar12 == 0);
          if (iVar12 == 7) {
            iVar12 = 0;
          }
          if (iVar12 == 0) {
            iVar37 = (int)piVar35 - (int)piVar33;
            lVar34 = 0;
            cVar2 = (char)piVar35 * '\x10' + (char)piVar33 * -0x10;
            uVar13 = iVar37 - 0xfU;
            do {
              uVar31 = uVar13;
              cVar27 = cVar2;
              lVar28 = lVar34;
              pcVar38 = pcVar32 + lVar28;
              piVar36 = (int *)((long)piVar35 + lVar28);
              if ((pcVar38 <= source) || (piVar36 <= piVar33)) break;
              lVar34 = lVar28 + -1;
              cVar2 = cVar27 + -0x10;
              uVar13 = uVar31 - 1;
            } while (*(char *)((long)piVar35 + lVar28 + -1) == pcVar32[lVar28 + -1]);
            iVar20 = (int)lVar28;
            psVar23 = (short *)((long)dest + 1);
            if ((uint)(iVar37 + iVar20) < 0xf) {
              *dest = cVar27;
            }
            else {
              uVar17 = (ulong)(iVar37 - 0xfU) + lVar28;
              *dest = -0x10;
              if (0xfe < (int)uVar17) {
                if (0x1fc < (int)uVar31) {
                  uVar31 = 0x1fd;
                }
                uVar13 = (iVar37 - uVar31) + iVar20 + 0xef;
                memset(psVar23,0xff,(ulong)(uVar13 / 0xff + 1));
                psVar23 = (short *)((long)dest + (ulong)uVar13 / 0xff + 2);
                uVar17 = (ulong)(iVar37 + -0x10e + iVar20 + uVar13 / 0xff);
              }
              *(char *)psVar23 = (char)uVar17;
              psVar23 = (short *)((long)psVar23 + 1);
            }
            psVar6 = (short *)((ulong)(uint)((int)piVar36 - (int)piVar33) + (long)psVar23);
            do {
              *(undefined8 *)psVar23 = *(undefined8 *)piVar33;
              psVar23 = psVar23 + 4;
              piVar33 = piVar33 + 2;
              local_b8 = (long *)dest;
            } while (psVar23 < psVar6);
            do {
              *psVar6 = (short)piVar36 - (short)pcVar38;
              puVar15 = (ulong *)(piVar36 + 1);
              puVar10 = (ulong *)(pcVar38 + 4);
              puVar16 = puVar15;
              if (puVar15 < pcVar19 + -0xc) {
                uVar18 = *(ulong *)(piVar36 + 1) ^ *(ulong *)(pcVar38 + 4);
                uVar17 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> uVar17 & 1) == 0; uVar17 = uVar17 + 1) {
                  }
                }
                uVar17 = uVar17 >> 3 & 0x1fffffff;
                puVar16 = (ulong *)(piVar36 + 3);
                puVar10 = (ulong *)(pcVar38 + 0xc);
                if (*(ulong *)(pcVar38 + 4) == *(ulong *)(piVar36 + 1)) goto LAB_0010e26f;
              }
              else {
LAB_0010e26f:
                do {
                  if (pcVar19 + -0xc <= puVar16) {
                    if ((puVar16 < pcVar19 + -8) && ((int)*puVar10 == (int)*puVar16)) {
                      puVar16 = (ulong *)((long)puVar16 + 4);
                      puVar10 = (ulong *)((long)puVar10 + 4);
                    }
                    if ((puVar16 < pcVar19 + -6) && ((short)*puVar10 == (short)*puVar16)) {
                      puVar16 = (ulong *)((long)puVar16 + 2);
                      puVar10 = (ulong *)((long)puVar10 + 2);
                    }
                    if (puVar16 < source + (long)inputSize + -5) {
                      puVar16 = (ulong *)((long)puVar16 + (ulong)((char)*puVar10 == (char)*puVar16))
                      ;
                    }
                    uVar17 = (ulong)(uint)((int)puVar16 - (int)puVar15);
                    goto LAB_0010e2aa;
                  }
                  uVar17 = *puVar10;
                  uVar18 = *puVar16;
                  uVar26 = uVar18 ^ uVar17;
                  uVar5 = 0;
                  if (uVar26 != 0) {
                    for (; (uVar26 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
                    }
                  }
                  iVar37 = (int)puVar16;
                  puVar10 = puVar10 + 1;
                  puVar16 = puVar16 + 1;
                } while (uVar17 == uVar18);
                uVar17 = (ulong)((((uint)(uVar5 >> 3) & 0x1fffffff) + iVar37) - (int)puVar15);
              }
LAB_0010e2aa:
              dest = (char *)(psVar6 + 1);
              uVar13 = (uint)uVar17;
              if (uVar13 < 0xf) {
                *(char *)local_b8 = (char)*local_b8 + (char)uVar17;
              }
              else {
                *(char *)local_b8 = (char)*local_b8 + '\x0f';
                uVar31 = uVar13 - 0xf;
                *(short *)((long)dest + 0) = -1;
                *(short *)((long)dest + 2) = -1;
                if (0x3fb < uVar31) {
                  uVar13 = uVar13 - 0x40b;
                  memset(psVar6 + 3,0xff,(ulong)((uVar13 / 0x3fc) * 4 + 4));
                  uVar31 = uVar13 % 0x3fc;
                  dest = (char *)((long)psVar6 + (ulong)((uVar13 / 0x3fc) * 4) + 6);
                }
                pcVar32 = (char *)((long)dest + (ulong)uVar31 / 0xff);
                dest = pcVar32 + 1;
                *pcVar32 = (char)(uVar31 / 0xff) + (char)uVar31;
              }
              lVar34 = (long)piVar36 + uVar17;
              piVar33 = (int *)(lVar34 + 4);
              if (source + (long)inputSize + -0xb <= piVar33) {
                iVar12 = 3;
                pcVar32 = pcVar38;
                piVar35 = piVar33;
                goto LAB_0010e3f1;
              }
              *(short *)((long)pvVar29 +
                        (ulong)((uint)(*(int *)(lVar34 + 2) * -0x61c8864f) >> 0x13) * 2) =
                   ((short)lVar34 + 2) - sVar1;
              uVar17 = (ulong)((uint)(*piVar33 * -0x61c8864f) >> 0x13);
              uVar18 = (ulong)*(ushort *)((long)pvVar29 + uVar17 * 2);
              *(short *)((long)pvVar29 + uVar17 * 2) = (short)piVar33 - sVar1;
              iVar37 = *(int *)(uVar8 + uVar18);
              iVar20 = *piVar33;
              psVar6 = (short *)dest;
              if (iVar37 == iVar20) {
                *dest = '\0';
                psVar6 = (short *)((long)dest + 1);
                local_b8 = (long *)dest;
              }
              pcVar38 = (char *)(uVar18 + uVar8);
              piVar36 = piVar33;
            } while (iVar37 == iVar20);
            uVar14 = (uint)(*(int *)(lVar34 + 5) * -0x61c8864f) >> 0x13;
            iVar12 = 0;
            dest = (char *)psVar6;
            pcVar32 = pcVar38;
            piVar35 = (int *)(lVar34 + 5);
          }
LAB_0010e3f1:
        } while (iVar12 == 0);
        source = (char *)piVar33;
        if (1 < iVar12 - 2U) {
          return 0;
        }
      }
      uVar8 = (long)pcVar19 - (long)source;
      if (uVar8 < 0xf) {
        *dest = (char)uVar8 << 4;
      }
      else {
        uVar17 = uVar8 - 0xf;
        *dest = -0x10;
        psVar23 = (short *)((long)dest + 1);
        if (0xfe < uVar17) {
          uVar17 = (uVar8 - 0x10e) / 0xff;
          memset(psVar23,0xff,uVar17 + 1);
          psVar23 = (short *)((long)dest + uVar17 + 2);
          uVar17 = (uVar8 + uVar17 * -0xff) - 0x10e;
        }
        *(char *)psVar23 = (char)uVar17;
        dest = (char *)psVar23;
      }
      memcpy((char *)((long)dest + 1),source,uVar8);
      iVar37 = (int)(char *)((long)dest + 1) + (int)uVar8;
LAB_0010e5d0:
      return iVar37 - local_68;
    }
  }
  else if ((uint)inputSize < 0x7e000001) {
    *(int *)((long)pvVar29 + 0x4018) = *(int *)((long)pvVar29 + 0x4018) + inputSize;
    *(uint *)((long)pvVar29 + 0x4000) = inputSize + uVar14;
    *(undefined2 *)((long)pvVar29 + 0x4006) = 2;
    *(uint *)((long)pvVar29 + ((ulong)(*(long *)source * -0x30e4432345000000) >> 0x34) * 4) = uVar14
    ;
    plVar22 = (long *)(source + 1);
    uVar17 = (ulong)(*(long *)(source + 1) * -0x30e4432345000000) >> 0x34;
    plVar21 = (long *)source;
    do {
      iVar12 = 1;
      iVar37 = iVar3 << 6;
      while( true ) {
        plVar4 = (long *)((long)iVar12 + (long)plVar22);
        if (source + ((ulong)(uint)inputSize - 0xb) < plVar4) {
          iVar12 = 2;
        }
        else {
          uVar14 = *(uint *)((long)pvVar29 + uVar17 * 4);
          uVar13 = (int)plVar22 - iVar20;
          piVar33 = (int *)(uVar14 + uVar8);
          uVar18 = (ulong)(*plVar4 * -0x30e4432345000000) >> 0x34;
          *(uint *)((long)pvVar29 + uVar17 * 4) = uVar13;
          iVar12 = 8;
          uVar17 = uVar18;
          if ((uVar13 <= uVar14 + 0xffff) && (iVar12 = 7, *piVar33 != (int)*plVar22)) {
            iVar12 = 0;
          }
        }
        if ((iVar12 != 0) && (iVar12 != 8)) break;
        iVar12 = iVar37 >> 6;
        iVar37 = iVar37 + 1;
        plVar22 = plVar4;
      }
      if (iVar12 == 7) {
        iVar12 = 0;
      }
      if (iVar12 == 0) {
        iVar37 = (int)plVar22 - (int)plVar21;
        lVar34 = 0;
        uVar14 = iVar37 - 0xfU;
        cVar2 = (char)plVar22 * '\x10' + (char)plVar21 * -0x10;
        do {
          cVar27 = cVar2;
          uVar13 = uVar14;
          lVar28 = lVar34;
          piVar35 = (int *)((long)piVar33 + lVar28);
          plVar4 = (long *)((long)plVar22 + lVar28);
          if ((piVar35 <= source) || (plVar4 <= plVar21)) break;
          lVar34 = lVar28 + -1;
          uVar14 = uVar13 - 1;
          cVar2 = cVar27 + -0x10;
        } while (*(char *)((long)plVar22 + lVar28 + -1) == *(char *)((long)piVar33 + lVar28 + -1));
        iVar12 = (int)lVar28;
        plVar22 = (long *)((long)dest + 1);
        if ((uint)(iVar37 + iVar12) < 0xf) {
          *dest = cVar27;
        }
        else {
          uVar18 = (ulong)(iVar37 - 0xfU) + lVar28;
          *dest = -0x10;
          if (0xfe < (int)uVar18) {
            if (0x1fc < (int)uVar13) {
              uVar13 = 0x1fd;
            }
            uVar14 = (iVar37 - uVar13) + iVar12 + 0xef;
            uVar18 = (ulong)uVar14 / 0xff;
            memset(plVar22,0xff,(ulong)(uVar14 / 0xff + 1));
            plVar22 = (long *)((long)dest + uVar18 + 2);
            uVar18 = (ulong)(uint)(iVar37 + -0x10e + iVar12 + (int)uVar18 * -0xff);
          }
          *(char *)plVar22 = (char)uVar18;
          plVar22 = (long *)((long)plVar22 + 1);
        }
        plVar9 = (long *)((ulong)(uint)((int)plVar4 - (int)plVar21) + (long)plVar22);
        do {
          *plVar22 = *plVar21;
          plVar22 = plVar22 + 1;
          plVar21 = plVar21 + 1;
          piVar33 = piVar35;
          plVar30 = (long *)dest;
        } while (plVar22 < plVar9);
        do {
          *(short *)plVar9 = (short)plVar4 - (short)piVar33;
          puVar15 = (ulong *)((long)plVar4 + 4);
          puVar16 = (ulong *)(piVar33 + 1);
          puVar10 = puVar15;
          if (puVar15 < source + ((ulong)(uint)inputSize - 0xc)) {
            uVar5 = *(ulong *)((long)plVar4 + 4) ^ *(ulong *)(piVar33 + 1);
            uVar18 = 0;
            if (uVar5 != 0) {
              for (; (uVar5 >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
              }
            }
            uVar18 = uVar18 >> 3 & 0x1fffffff;
            puVar10 = (ulong *)((long)plVar4 + 0xc);
            puVar16 = (ulong *)(piVar33 + 3);
            if (*(ulong *)(piVar33 + 1) == *(ulong *)((long)plVar4 + 4)) goto LAB_0010d7c0;
          }
          else {
LAB_0010d7c0:
            do {
              if (source + ((ulong)(uint)inputSize - 0xc) <= puVar10) {
                if ((puVar10 < source + ((ulong)(uint)inputSize - 8)) &&
                   ((int)*puVar16 == (int)*puVar10)) {
                  puVar10 = (ulong *)((long)puVar10 + 4);
                  puVar16 = (ulong *)((long)puVar16 + 4);
                }
                if ((puVar10 < source + ((ulong)(uint)inputSize - 6)) &&
                   ((short)*puVar16 == (short)*puVar10)) {
                  puVar10 = (ulong *)((long)puVar10 + 2);
                  puVar16 = (ulong *)((long)puVar16 + 2);
                }
                if (puVar10 < source + ((ulong)(uint)inputSize - 5)) {
                  puVar10 = (ulong *)((long)puVar10 + (ulong)((char)*puVar16 == (char)*puVar10));
                }
                uVar18 = (ulong)(uint)((int)puVar10 - (int)puVar15);
                goto LAB_0010d7fb;
              }
              uVar18 = *puVar16;
              uVar5 = *puVar10;
              uVar25 = uVar5 ^ uVar18;
              uVar26 = 0;
              if (uVar25 != 0) {
                for (; (uVar25 >> uVar26 & 1) == 0; uVar26 = uVar26 + 1) {
                }
              }
              iVar37 = (int)puVar10;
              puVar16 = puVar16 + 1;
              puVar10 = puVar10 + 1;
            } while (uVar18 == uVar5);
            uVar18 = (ulong)((((uint)(uVar26 >> 3) & 0x1fffffff) + iVar37) - (int)puVar15);
          }
LAB_0010d7fb:
          dest = (char *)((long)plVar9 + 2);
          uVar14 = (uint)uVar18;
          if (uVar14 < 0xf) {
            *(char *)plVar30 = (char)*plVar30 + (char)uVar18;
          }
          else {
            *(char *)plVar30 = (char)*plVar30 + '\x0f';
            uVar13 = uVar14 - 0xf;
            *(undefined4 *)dest = 0xffffffff;
            if (0x3fb < uVar13) {
              uVar14 = uVar14 - 0x40b;
              memset((char *)((long)plVar9 + 6),0xff,(ulong)((uVar14 / 0x3fc) * 4 + 4));
              uVar13 = uVar14 % 0x3fc;
              dest = (char *)((long)plVar9 + (ulong)((uVar14 / 0x3fc) * 4) + 6);
            }
            pcVar19 = (char *)((long)dest + (ulong)uVar13 / 0xff);
            dest = pcVar19 + 1;
            *pcVar19 = (char)(uVar13 / 0xff) + (char)uVar13;
          }
          lVar34 = (long)plVar4 + uVar18;
          plVar4 = (long *)(lVar34 + 4);
          plVar21 = plVar4;
          if (source + ((ulong)(uint)inputSize - 0xb) <= plVar4) {
            iVar12 = 3;
            plVar22 = plVar4;
            goto LAB_0010d9ce;
          }
          *(int *)((long)pvVar29 +
                  ((ulong)(*(long *)(lVar34 + 2) * -0x30e4432345000000) >> 0x34) * 4) =
               ((int)lVar34 + 2) - iVar20;
          uVar18 = (ulong)(*plVar4 * -0x30e4432345000000) >> 0x34;
          uVar13 = (int)plVar4 - iVar20;
          uVar14 = *(uint *)((long)pvVar29 + uVar18 * 4);
          piVar33 = (int *)(uVar14 + uVar8);
          *(uint *)((long)pvVar29 + uVar18 * 4) = uVar13;
          bVar39 = true;
          plVar9 = (long *)dest;
          if ((uVar13 <= uVar14 + 0xffff) && (*piVar33 == *(int *)plVar4)) {
            *dest = '\0';
            bVar39 = false;
            plVar9 = (long *)((long)dest + 1);
            plVar30 = (long *)dest;
          }
        } while (!bVar39);
        uVar17 = (ulong)(*(long *)(lVar34 + 5) * -0x30e4432345000000) >> 0x34;
        iVar12 = 0;
        plVar22 = (long *)(lVar34 + 5);
        dest = (char *)plVar9;
      }
LAB_0010d9ce:
    } while (iVar12 == 0);
    if (iVar12 - 2U < 2) {
      pcVar19 = source + ((ulong)(uint)inputSize - (long)plVar21);
      if (pcVar19 < (char *)0xf) {
        *dest = (char)pcVar19 << 4;
      }
      else {
        pcVar32 = pcVar19 + -0xf;
        *dest = -0x10;
        plVar22 = (long *)((long)dest + 1);
        if ((char *)0xfe < pcVar32) {
          uVar8 = (ulong)(pcVar19 + -0x10e) / 0xff;
          memset(plVar22,0xff,uVar8 + 1);
          plVar22 = (long *)((long)dest + uVar8 + 2);
          pcVar32 = pcVar19 + uVar8 * -0xff + -0x10e;
        }
        *(char *)plVar22 = (char)pcVar32;
        dest = (char *)plVar22;
      }
      memcpy((char *)((long)dest + 1),plVar21,(size_t)pcVar19);
      iVar37 = (int)(char *)((long)dest + 1) + (int)pcVar19;
      goto LAB_0010e5d0;
    }
  }
  return 0;
}

Assistant:

int LZ4_compress_fast_extState(void* state, const char* source, char* dest, int inputSize, int maxOutputSize, int acceleration)
{
    LZ4_stream_t_internal* const ctx = & LZ4_initStream(state, sizeof(LZ4_stream_t)) -> internal_donotuse;
    assert(ctx != NULL);
    if (acceleration < 1) acceleration = ACCELERATION_DEFAULT;
    if (maxOutputSize >= LZ4_compressBound(inputSize)) {
        if (inputSize < LZ4_64Klimit) {
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, 0, notLimited, byU16, noDict, noDictIssue, acceleration);
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)source > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, 0, notLimited, tableType, noDict, noDictIssue, acceleration);
        }
    } else {
        if (inputSize < LZ4_64Klimit) {
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, byU16, noDict, noDictIssue, acceleration);
        } else {
            const tableType_t tableType = ((sizeof(void*)==4) && ((uptrval)source > LZ4_DISTANCE_MAX)) ? byPtr : byU32;
            return LZ4_compress_generic(ctx, source, dest, inputSize, NULL, maxOutputSize, limitedOutput, tableType, noDict, noDictIssue, acceleration);
        }
    }
}